

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Context.cpp
# Opt level: O0

bool __thiscall sf::Context::setActive(Context *this,bool active)

{
  bool bVar1;
  Context *local_28;
  bool result;
  bool active_local;
  Context *this_local;
  
  bVar1 = priv::GlContext::setActive(this->m_context,active);
  if (bVar1) {
    local_28 = this;
    if (!active) {
      local_28 = (Context *)0x0;
    }
    ThreadLocalPtr<sf::Context>::operator=
              ((ThreadLocalPtr<sf::Context> *)&(anonymous_namespace)::currentContext,local_28);
  }
  return bVar1;
}

Assistant:

bool Context::setActive(bool active)
{
    bool result = m_context->setActive(active);

    if (result)
        currentContext = (active ? this : NULL);

    return result;
}